

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_jnt_convolve_avx2.c
# Opt level: O3

void av1_highbd_dist_wtd_convolve_2d_copy_avx2
               (uint16_t *src,int src_stride,uint16_t *dst0,int dst_stride0,int w,int h,
               ConvolveParams *conv_params,int bd)

{
  int iVar1;
  int iVar2;
  char cVar3;
  long lVar4;
  uint uVar5;
  CONV_BUF_TYPE *pCVar6;
  int iVar7;
  CONV_BUF_TYPE *pCVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  undefined2 uVar12;
  long lVar13;
  undefined2 uVar14;
  uint16_t *puVar15;
  uint16_t *puVar16;
  int iVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  
  iVar7 = conv_params->round_0 + conv_params->round_1;
  cVar3 = (char)bd - (char)iVar7;
  uVar5 = 0xe - iVar7;
  iVar17 = (1 << (cVar3 + 0xdU & 0x1f)) + (1 << (cVar3 + 0xeU & 0x1f));
  iVar7 = (1 << ((byte)uVar5 & 0x1f)) >> 1;
  uVar12 = 0xff;
  if (bd == 0xc) {
    uVar12 = 0xfff;
  }
  pCVar6 = conv_params->dst;
  uVar14 = 0x3ff;
  if (bd != 10) {
    uVar14 = uVar12;
  }
  lVar13 = (long)conv_params->dst_stride;
  iVar2 = conv_params->do_average;
  iVar1 = conv_params->fwd_offset;
  auVar19._4_4_ = iVar1;
  auVar19._0_4_ = iVar1;
  auVar19._8_4_ = iVar1;
  auVar19._12_4_ = iVar1;
  auVar19._16_4_ = iVar1;
  auVar19._20_4_ = iVar1;
  auVar19._24_4_ = iVar1;
  auVar19._28_4_ = iVar1;
  iVar1 = conv_params->bck_offset;
  auVar20._4_4_ = iVar1;
  auVar20._0_4_ = iVar1;
  auVar20._8_4_ = iVar1;
  auVar20._12_4_ = iVar1;
  auVar20._16_4_ = iVar1;
  auVar20._20_4_ = iVar1;
  auVar20._24_4_ = iVar1;
  auVar20._28_4_ = iVar1;
  iVar1 = conv_params->use_dist_wtd_comp_avg;
  auVar21._4_4_ = iVar17;
  auVar21._0_4_ = iVar17;
  auVar21._8_4_ = iVar17;
  auVar21._12_4_ = iVar17;
  auVar21._16_4_ = iVar17;
  auVar21._20_4_ = iVar17;
  auVar21._24_4_ = iVar17;
  auVar21._28_4_ = iVar17;
  auVar22._0_2_ = (undefined2)iVar17;
  auVar22._2_2_ = auVar22._0_2_;
  auVar22._4_2_ = auVar22._0_2_;
  auVar22._6_2_ = auVar22._0_2_;
  auVar22._8_2_ = auVar22._0_2_;
  auVar22._10_2_ = auVar22._0_2_;
  auVar22._12_2_ = auVar22._0_2_;
  auVar22._14_2_ = auVar22._0_2_;
  auVar22._16_2_ = auVar22._0_2_;
  auVar22._18_2_ = auVar22._0_2_;
  auVar22._20_2_ = auVar22._0_2_;
  auVar22._22_2_ = auVar22._0_2_;
  auVar22._24_2_ = auVar22._0_2_;
  auVar22._26_2_ = auVar22._0_2_;
  auVar22._28_2_ = auVar22._0_2_;
  auVar22._30_2_ = auVar22._0_2_;
  auVar24._4_4_ = iVar7;
  auVar24._0_4_ = iVar7;
  auVar24._8_4_ = iVar7;
  auVar24._12_4_ = iVar7;
  auVar24._16_4_ = iVar7;
  auVar24._20_4_ = iVar7;
  auVar24._24_4_ = iVar7;
  auVar24._28_4_ = iVar7;
  auVar23._2_2_ = uVar14;
  auVar23._0_2_ = uVar14;
  auVar23._4_2_ = uVar14;
  auVar23._6_2_ = uVar14;
  auVar23._8_2_ = uVar14;
  auVar23._10_2_ = uVar14;
  auVar23._12_2_ = uVar14;
  auVar23._14_2_ = uVar14;
  auVar23._16_2_ = uVar14;
  auVar23._18_2_ = uVar14;
  auVar23._20_2_ = uVar14;
  auVar23._22_2_ = uVar14;
  auVar23._24_2_ = uVar14;
  auVar23._26_2_ = uVar14;
  auVar23._28_2_ = uVar14;
  auVar23._30_2_ = uVar14;
  auVar18 = ZEXT416(uVar5);
  if ((w & 0xfU) == 0) {
    if (0 < h) {
      auVar24 = vpsubd_avx2(auVar24,auVar21);
      uVar11 = 0;
      pCVar8 = pCVar6;
      do {
        if (0 < w) {
          lVar4 = 0;
          do {
            auVar27 = vpsllw_avx2(*(undefined1 (*) [32])(src + lVar4),auVar18);
            if (iVar2 == 0) {
              auVar27 = vpaddusw_avx2(auVar27,auVar22);
              puVar16 = pCVar6 + uVar11 * lVar13;
            }
            else {
              auVar26 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
              auVar29 = vpunpcklwd_avx2(*(undefined1 (*) [32])(pCVar8 + lVar4),auVar26);
              auVar28 = vpunpckhwd_avx2(*(undefined1 (*) [32])(pCVar8 + lVar4),auVar26);
              auVar25 = vpunpcklwd_avx2(auVar27,auVar26);
              auVar25 = vpaddd_avx2(auVar25,auVar21);
              auVar27 = vpunpckhwd_avx2(auVar27,auVar26);
              if (iVar1 == 0) {
                auVar25 = vpaddd_avx2(auVar25,auVar29);
                auVar29 = vpsrad_avx2(auVar25,1);
                auVar25 = vpaddd_avx2(auVar28,auVar21);
                auVar27 = vpaddd_avx2(auVar25,auVar27);
                auVar27 = vpsrad_avx2(auVar27,1);
              }
              else {
                auVar29 = vpmulld_avx2(auVar19,auVar29);
                auVar25 = vpmulld_avx2(auVar25,auVar20);
                auVar25 = vpaddd_avx2(auVar29,auVar25);
                auVar29 = vpsrad_avx2(auVar25,4);
                auVar27 = vpaddd_avx2(auVar27,auVar21);
                auVar25 = vpmulld_avx2(auVar19,auVar28);
                auVar27 = vpmulld_avx2(auVar27,auVar20);
                auVar27 = vpaddd_avx2(auVar25,auVar27);
                auVar27 = vpsrad_avx2(auVar27,4);
              }
              auVar25 = vpaddd_avx2(auVar29,auVar24);
              auVar25 = vpsrad_avx2(auVar25,auVar18);
              auVar27 = vpaddd_avx2(auVar27,auVar24);
              auVar27 = vpsrad_avx2(auVar27,auVar18);
              auVar27 = vpackusdw_avx2(auVar25,auVar27);
              auVar27 = vpminsw_avx2(auVar27,auVar23);
              puVar16 = dst0 + uVar11 * (long)dst_stride0;
            }
            *(undefined1 (*) [32])(puVar16 + lVar4) = auVar27;
            lVar4 = lVar4 + 0x10;
          } while (lVar4 < w);
        }
        uVar11 = uVar11 + 1;
        pCVar8 = pCVar8 + lVar13;
        src = src + src_stride;
      } while (uVar11 != (uint)h);
    }
  }
  else if (0 < h && (w & 3U) == 0) {
    auVar24 = vpsubd_avx2(auVar24,auVar21);
    lVar9 = (long)src_stride;
    lVar4 = (long)dst_stride0;
    puVar16 = src + lVar9;
    puVar15 = dst0 + lVar4;
    pCVar8 = pCVar6 + lVar13;
    uVar11 = 0;
    do {
      if (0 < w) {
        lVar10 = 0;
        do {
          auVar27._0_16_ =
               ZEXT116(0) * *(undefined1 (*) [16])(puVar16 + lVar10) +
               ZEXT116(1) * *(undefined1 (*) [16])(src + lVar10);
          auVar27._16_16_ =
               ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
               ZEXT116(1) * *(undefined1 (*) [16])(puVar16 + lVar10);
          auVar27 = vpsllw_avx2(auVar27,auVar18);
          auVar25 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
          if ((long)w + -8 < lVar10) {
            if (iVar2 == 0) {
              auVar27 = vpaddusw_avx2(auVar27,auVar22);
              *(long *)(pCVar6 + lVar10) = auVar27._0_8_;
              *(long *)(pCVar8 + lVar10) = auVar27._16_8_;
            }
            else {
              auVar30._8_8_ = 0;
              auVar30._0_8_ = *(ulong *)(pCVar8 + lVar10);
              auVar31._8_8_ = 0;
              auVar31._0_8_ = *(ulong *)(pCVar6 + lVar10);
              auVar29._0_16_ = ZEXT116(0) * auVar30 + ZEXT116(1) * auVar31;
              auVar29._16_16_ = ZEXT116(1) * auVar30;
              auVar28 = vpunpcklwd_avx2(auVar29,auVar25);
              auVar27 = vpunpcklwd_avx2(auVar27,auVar25);
              auVar27 = vpaddd_avx2(auVar27,auVar21);
              if (iVar1 == 0) {
                auVar27 = vpaddd_avx2(auVar27,auVar28);
                auVar27 = vpsrad_avx2(auVar27,1);
              }
              else {
                auVar25 = vpmulld_avx2(auVar19,auVar28);
                auVar27 = vpmulld_avx2(auVar27,auVar20);
                auVar27 = vpaddd_avx2(auVar25,auVar27);
                auVar27 = vpsrad_avx2(auVar27,4);
              }
              auVar27 = vpaddd_avx2(auVar27,auVar24);
              auVar27 = vpsrad_avx2(auVar27,auVar18);
              auVar27 = vpackusdw_avx2(auVar27,auVar27);
              auVar27 = vpminsw_avx2(auVar27,auVar23);
              *(long *)(dst0 + lVar10) = auVar27._0_8_;
              *(long *)(puVar15 + lVar10) = auVar27._16_8_;
            }
          }
          else if (iVar2 == 0) {
            auVar27 = vpaddusw_avx2(auVar27,auVar22);
            *(undefined1 (*) [16])(pCVar6 + lVar10) = auVar27._0_16_;
            *(undefined1 (*) [16])(pCVar8 + lVar10) = auVar27._16_16_;
          }
          else {
            auVar28._0_16_ =
                 ZEXT116(0) * *(undefined1 (*) [16])(pCVar8 + lVar10) +
                 ZEXT116(1) * *(undefined1 (*) [16])(pCVar6 + lVar10);
            auVar28._16_16_ =
                 ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                 ZEXT116(1) * *(undefined1 (*) [16])(pCVar8 + lVar10);
            auVar26 = vpunpcklwd_avx2(auVar28,auVar25);
            auVar29 = vpunpckhwd_avx2(auVar28,auVar25);
            auVar28 = vpunpcklwd_avx2(auVar27,auVar25);
            auVar28 = vpaddd_avx2(auVar28,auVar21);
            auVar27 = vpunpckhwd_avx2(auVar27,auVar25);
            if (iVar1 == 0) {
              auVar25 = vpaddd_avx2(auVar28,auVar26);
              auVar28 = vpsrad_avx2(auVar25,1);
              auVar25 = vpaddd_avx2(auVar29,auVar21);
              auVar27 = vpaddd_avx2(auVar25,auVar27);
              auVar27 = vpsrad_avx2(auVar27,1);
            }
            else {
              auVar25 = vpmulld_avx2(auVar19,auVar26);
              auVar28 = vpmulld_avx2(auVar28,auVar20);
              auVar25 = vpaddd_avx2(auVar25,auVar28);
              auVar28 = vpsrad_avx2(auVar25,4);
              auVar27 = vpaddd_avx2(auVar27,auVar21);
              auVar25 = vpmulld_avx2(auVar19,auVar29);
              auVar27 = vpmulld_avx2(auVar27,auVar20);
              auVar27 = vpaddd_avx2(auVar25,auVar27);
              auVar27 = vpsrad_avx2(auVar27,4);
            }
            auVar25 = vpaddd_avx2(auVar28,auVar24);
            auVar25 = vpsrad_avx2(auVar25,auVar18);
            auVar27 = vpaddd_avx2(auVar27,auVar24);
            auVar27 = vpsrad_avx2(auVar27,auVar18);
            auVar27 = vpackusdw_avx2(auVar25,auVar27);
            auVar27 = vpminsw_avx2(auVar27,auVar23);
            *(undefined1 (*) [16])(dst0 + lVar10) = auVar27._0_16_;
            *(undefined1 (*) [16])(puVar15 + lVar10) = auVar27._16_16_;
          }
          lVar10 = lVar10 + 8;
        } while (lVar10 < w);
      }
      uVar11 = uVar11 + 2;
      pCVar8 = pCVar8 + lVar13 * 2;
      pCVar6 = pCVar6 + lVar13 * 2;
      puVar15 = puVar15 + lVar4 * 2;
      dst0 = dst0 + lVar4 * 2;
      puVar16 = puVar16 + lVar9 * 2;
      src = src + lVar9 * 2;
    } while (uVar11 < (uint)h);
  }
  return;
}

Assistant:

void av1_highbd_dist_wtd_convolve_2d_copy_avx2(const uint16_t *src,
                                               int src_stride, uint16_t *dst0,
                                               int dst_stride0, int w, int h,
                                               ConvolveParams *conv_params,
                                               int bd) {
  CONV_BUF_TYPE *dst = conv_params->dst;
  int dst_stride = conv_params->dst_stride;

  const int bits =
      FILTER_BITS * 2 - conv_params->round_1 - conv_params->round_0;
  const __m128i left_shift = _mm_cvtsi32_si128(bits);
  const int do_average = conv_params->do_average;
  const int use_dist_wtd_comp_avg = conv_params->use_dist_wtd_comp_avg;
  const int w0 = conv_params->fwd_offset;
  const int w1 = conv_params->bck_offset;
  const __m256i wt0 = _mm256_set1_epi32(w0);
  const __m256i wt1 = _mm256_set1_epi32(w1);
  const __m256i zero = _mm256_setzero_si256();
  int i, j;

  const int offset_0 =
      bd + 2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const int offset = (1 << offset_0) + (1 << (offset_0 - 1));
  const __m256i offset_const = _mm256_set1_epi32(offset);
  const __m256i offset_const_16b = _mm256_set1_epi16(offset);
  const int rounding_shift =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const __m256i rounding_const = _mm256_set1_epi32((1 << rounding_shift) >> 1);
  const __m256i clip_pixel_to_bd =
      _mm256_set1_epi16(bd == 10 ? 1023 : (bd == 12 ? 4095 : 255));

  assert(bits <= 4);

  if (!(w % 16)) {
    for (i = 0; i < h; i += 1) {
      for (j = 0; j < w; j += 16) {
        const __m256i src_16bit =
            _mm256_loadu_si256((__m256i *)(&src[i * src_stride + j]));

        const __m256i res = _mm256_sll_epi16(src_16bit, left_shift);

        if (do_average) {
          const __m256i data_0 =
              _mm256_loadu_si256((__m256i *)(&dst[i * dst_stride + j]));

          const __m256i data_ref_0_lo = _mm256_unpacklo_epi16(data_0, zero);
          const __m256i data_ref_0_hi = _mm256_unpackhi_epi16(data_0, zero);

          const __m256i res_32b_lo = _mm256_unpacklo_epi16(res, zero);
          const __m256i res_unsigned_lo =
              _mm256_add_epi32(res_32b_lo, offset_const);

          const __m256i comp_avg_res_lo =
              highbd_comp_avg(&data_ref_0_lo, &res_unsigned_lo, &wt0, &wt1,
                              use_dist_wtd_comp_avg);

          const __m256i res_32b_hi = _mm256_unpackhi_epi16(res, zero);
          const __m256i res_unsigned_hi =
              _mm256_add_epi32(res_32b_hi, offset_const);

          const __m256i comp_avg_res_hi =
              highbd_comp_avg(&data_ref_0_hi, &res_unsigned_hi, &wt0, &wt1,
                              use_dist_wtd_comp_avg);

          const __m256i round_result_lo = highbd_convolve_rounding(
              &comp_avg_res_lo, &offset_const, &rounding_const, rounding_shift);
          const __m256i round_result_hi = highbd_convolve_rounding(
              &comp_avg_res_hi, &offset_const, &rounding_const, rounding_shift);

          const __m256i res_16b =
              _mm256_packus_epi32(round_result_lo, round_result_hi);
          const __m256i res_clip = _mm256_min_epi16(res_16b, clip_pixel_to_bd);

          _mm256_store_si256((__m256i *)(&dst0[i * dst_stride0 + j]), res_clip);
        } else {
          const __m256i res_unsigned_16b =
              _mm256_adds_epu16(res, offset_const_16b);

          _mm256_store_si256((__m256i *)(&dst[i * dst_stride + j]),
                             res_unsigned_16b);
        }
      }
    }
  } else if (!(w % 4)) {
    for (i = 0; i < h; i += 2) {
      for (j = 0; j < w; j += 8) {
        const __m128i src_row_0 =
            _mm_loadu_si128((__m128i *)(&src[i * src_stride + j]));
        const __m128i src_row_1 =
            _mm_loadu_si128((__m128i *)(&src[i * src_stride + j + src_stride]));
        // since not all compilers yet support _mm256_set_m128i()
        const __m256i src_10 = _mm256_insertf128_si256(
            _mm256_castsi128_si256(src_row_0), src_row_1, 1);

        const __m256i res = _mm256_sll_epi16(src_10, left_shift);

        if (w - j < 8) {
          if (do_average) {
            const __m256i data_0 = _mm256_castsi128_si256(
                _mm_loadl_epi64((__m128i *)(&dst[i * dst_stride + j])));
            const __m256i data_1 = _mm256_castsi128_si256(_mm_loadl_epi64(
                (__m128i *)(&dst[i * dst_stride + j + dst_stride])));
            const __m256i data_01 =
                _mm256_permute2x128_si256(data_0, data_1, 0x20);

            const __m256i data_ref_0 = _mm256_unpacklo_epi16(data_01, zero);

            const __m256i res_32b = _mm256_unpacklo_epi16(res, zero);
            const __m256i res_unsigned_lo =
                _mm256_add_epi32(res_32b, offset_const);

            const __m256i comp_avg_res =
                highbd_comp_avg(&data_ref_0, &res_unsigned_lo, &wt0, &wt1,
                                use_dist_wtd_comp_avg);

            const __m256i round_result = highbd_convolve_rounding(
                &comp_avg_res, &offset_const, &rounding_const, rounding_shift);

            const __m256i res_16b =
                _mm256_packus_epi32(round_result, round_result);
            const __m256i res_clip =
                _mm256_min_epi16(res_16b, clip_pixel_to_bd);

            const __m128i res_0 = _mm256_castsi256_si128(res_clip);
            const __m128i res_1 = _mm256_extracti128_si256(res_clip, 1);

            _mm_storel_epi64((__m128i *)(&dst0[i * dst_stride0 + j]), res_0);
            _mm_storel_epi64(
                (__m128i *)(&dst0[i * dst_stride0 + j + dst_stride0]), res_1);
          } else {
            const __m256i res_unsigned_16b =
                _mm256_adds_epu16(res, offset_const_16b);

            const __m128i res_0 = _mm256_castsi256_si128(res_unsigned_16b);
            const __m128i res_1 = _mm256_extracti128_si256(res_unsigned_16b, 1);

            _mm_storel_epi64((__m128i *)(&dst[i * dst_stride + j]), res_0);
            _mm_storel_epi64((__m128i *)(&dst[i * dst_stride + j + dst_stride]),
                             res_1);
          }
        } else {
          if (do_average) {
            const __m256i data_0 = _mm256_castsi128_si256(
                _mm_loadu_si128((__m128i *)(&dst[i * dst_stride + j])));
            const __m256i data_1 = _mm256_castsi128_si256(_mm_loadu_si128(
                (__m128i *)(&dst[i * dst_stride + j + dst_stride])));
            const __m256i data_01 =
                _mm256_permute2x128_si256(data_0, data_1, 0x20);

            const __m256i data_ref_0_lo = _mm256_unpacklo_epi16(data_01, zero);
            const __m256i data_ref_0_hi = _mm256_unpackhi_epi16(data_01, zero);

            const __m256i res_32b_lo = _mm256_unpacklo_epi16(res, zero);
            const __m256i res_unsigned_lo =
                _mm256_add_epi32(res_32b_lo, offset_const);

            const __m256i comp_avg_res_lo =
                highbd_comp_avg(&data_ref_0_lo, &res_unsigned_lo, &wt0, &wt1,
                                use_dist_wtd_comp_avg);

            const __m256i res_32b_hi = _mm256_unpackhi_epi16(res, zero);
            const __m256i res_unsigned_hi =
                _mm256_add_epi32(res_32b_hi, offset_const);

            const __m256i comp_avg_res_hi =
                highbd_comp_avg(&data_ref_0_hi, &res_unsigned_hi, &wt0, &wt1,
                                use_dist_wtd_comp_avg);

            const __m256i round_result_lo =
                highbd_convolve_rounding(&comp_avg_res_lo, &offset_const,
                                         &rounding_const, rounding_shift);
            const __m256i round_result_hi =
                highbd_convolve_rounding(&comp_avg_res_hi, &offset_const,
                                         &rounding_const, rounding_shift);

            const __m256i res_16b =
                _mm256_packus_epi32(round_result_lo, round_result_hi);
            const __m256i res_clip =
                _mm256_min_epi16(res_16b, clip_pixel_to_bd);

            const __m128i res_0 = _mm256_castsi256_si128(res_clip);
            const __m128i res_1 = _mm256_extracti128_si256(res_clip, 1);

            _mm_store_si128((__m128i *)(&dst0[i * dst_stride0 + j]), res_0);
            _mm_store_si128(
                (__m128i *)(&dst0[i * dst_stride0 + j + dst_stride0]), res_1);
          } else {
            const __m256i res_unsigned_16b =
                _mm256_adds_epu16(res, offset_const_16b);
            const __m128i res_0 = _mm256_castsi256_si128(res_unsigned_16b);
            const __m128i res_1 = _mm256_extracti128_si256(res_unsigned_16b, 1);

            _mm_store_si128((__m128i *)(&dst[i * dst_stride + j]), res_0);
            _mm_store_si128((__m128i *)(&dst[i * dst_stride + j + dst_stride]),
                            res_1);
          }
        }
      }
    }
  }
}